

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alert.cpp
# Opt level: O2

void __thiscall
libtorrent::storage_moved_alert::storage_moved_alert
          (storage_moved_alert *this,stack_allocator *alloc,torrent_handle *h,string_view p)

{
  allocation_slot aVar1;
  char *local_30;
  size_t local_28;
  
  local_28 = p.len_;
  local_30 = p.ptr_;
  torrent_alert::torrent_alert(&this->super_torrent_alert,alloc,h);
  (this->super_torrent_alert).super_alert._vptr_alert =
       (_func_int **)&PTR__storage_moved_alert_00430e58;
  aVar1 = aux::stack_allocator::copy_string(alloc,p);
  (this->m_path_idx).m_idx = aVar1.m_idx;
  boost::basic_string_view::operator_cast_to_string(&this->path,(basic_string_view *)&local_30);
  return;
}

Assistant:

storage_moved_alert::storage_moved_alert(aux::stack_allocator& alloc
		, torrent_handle const& h, string_view p)
		: torrent_alert(alloc, h)
		, m_path_idx(alloc.copy_string(p))
#if TORRENT_ABI_VERSION == 1
		, path(p)
#endif
	{}